

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

GCproto * lj_parse(LexState *ls)

{
  lua_State *L;
  char *__s;
  TValue *pTVar1;
  size_t lenx;
  GCstr *pGVar2;
  GCproto *pGVar3;
  FuncScope bl;
  FuncScope local_3f8;
  FuncState local_3e8;
  
  L = ls->L;
  __s = ls->chunkarg;
  lenx = strlen(__s);
  pGVar2 = lj_str_new(L,__s,lenx);
  ls->chunkname = pGVar2;
  L->top->u64 = (ulong)pGVar2 | 0xfffd800000000000;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  if ((TValue *)(L->maxstack).ptr64 <= pTVar1 + 1) {
    lj_state_growstack1(L);
  }
  ls->level = 0;
  fs_init(ls,&local_3e8);
  local_3e8.numparams = '\0';
  local_3e8._68_8_ = 0;
  local_3e8._76_8_ = 0;
  local_3e8.flags = local_3e8.flags | 2;
  local_3f8.nactvar = (uint8_t)local_3e8.nactvar;
  local_3f8.flags = '\0';
  local_3f8.vstart = (local_3e8.ls)->vtop;
  local_3f8.prev = local_3e8.bl;
  local_3e8.bl = &local_3f8;
  bcemit_INS(&local_3e8,0x5c);
  lj_lex_next(ls);
  parse_chunk(ls);
  if (ls->tok == 0x121) {
    pGVar3 = fs_finish(ls,ls->linenumber);
    L->top = L->top + -1;
    return pGVar3;
  }
  err_token(ls,0x121);
}

Assistant:

GCproto *lj_parse(LexState *ls)
{
  FuncState fs;
  FuncScope bl;
  GCproto *pt;
  lua_State *L = ls->L;
#ifdef LUAJIT_DISABLE_DEBUGINFO
  ls->chunkname = lj_str_newlit(L, "=");
#else
  ls->chunkname = lj_str_newz(L, ls->chunkarg);
#endif
  setstrV(L, L->top, ls->chunkname);  /* Anchor chunkname string. */
  incr_top(L);
  ls->level = 0;
  fs_init(ls, &fs);
  fs.linedefined = 0;
  fs.numparams = 0;
  fs.bcbase = NULL;
  fs.bclim = 0;
  fs.flags |= PROTO_VARARG;  /* Main chunk is always a vararg func. */
  fscope_begin(&fs, &bl, 0);
  bcemit_AD(&fs, BC_FUNCV, 0, 0);  /* Placeholder. */
  lj_lex_next(ls);  /* Read-ahead first token. */
  parse_chunk(ls);
  if (ls->tok != TK_eof)
    err_token(ls, TK_eof);
  pt = fs_finish(ls, ls->linenumber);
  L->top--;  /* Drop chunkname. */
  lj_assertL(fs.prev == NULL && ls->fs == NULL, "mismatched frame nesting");
  lj_assertL(pt->sizeuv == 0, "toplevel proto has upvalues");
  return pt;
}